

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O2

void __thiscall DisplayNCurses::render(DisplayNCurses *this,SatLookAngles *sats)

{
  pointer ppVar1;
  pointer ppVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ITEM **items;
  ulong *puVar8;
  ulong *puVar9;
  ostream *poVar10;
  WINDOW *win;
  long lVar11;
  undefined8 uVar12;
  MENU *menu;
  SatLookAngle *pSVar13;
  size_t i;
  long lVar14;
  undefined8 uVar15;
  ulong uVar16;
  bool bVar17;
  char *local_6a0;
  size_type local_698;
  char local_690;
  undefined7 uStack_68f;
  undefined8 uStack_688;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  undefined8 local_560;
  ulong *local_558;
  string *local_550;
  DateTime local_548;
  array<std::pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_12UL>
  fields;
  string colNames;
  stringstream ss_1;
  size_type local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  long alStack_320 [45];
  stringstream ss;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [88];
  
  ppVar1 = (sats->_sats).
           super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = (sats->_sats).
           super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)ppVar1 - (long)ppVar2) / 0xf8;
  uVar16 = -(ulong)(uVar7 + 1 >> 0x3d != 0) | uVar7 * 8 + 8;
  items = (ITEM **)operator_new__(uVar16);
  memset(items,0,uVar16);
  uVar16 = uVar7 << 5;
  puVar8 = (ulong *)operator_new__(-(ulong)(uVar7 >> 0x3b != 0) | uVar16 | 8);
  *puVar8 = uVar7;
  if (ppVar1 != ppVar2) {
    puVar9 = puVar8 + 3;
    do {
      puVar9[-2] = (ulong)puVar9;
      puVar9[-1] = 0;
      *(undefined1 *)puVar9 = 0;
      puVar9 = puVar9 + 4;
      uVar16 = uVar16 - 0x20;
    } while (uVar16 != 0);
  }
  items[uVar7] = (ITEM *)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 10;
  poVar10 = std::operator<<((ostream *)local_1a8,"ID");
  *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 0x19;
  poVar10 = std::operator<<(poVar10,"NAME");
  *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 0xf;
  poVar10 = std::operator<<(poVar10,"AZIMUTH(deg)");
  *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 0xf;
  poVar10 = std::operator<<(poVar10,"ELEVATION(deg)");
  *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 0xc;
  std::operator<<(poVar10,"RANGE(KM)");
  std::__cxx11::stringbuf::str();
  uVar7 = 0x19;
  if (0x19 < (int)_LINES) {
    uVar7 = (ulong)_LINES;
  }
  uVar16 = 0x50;
  if (0x50 < (int)_COLS) {
    uVar16 = (ulong)_COLS;
  }
  win = (WINDOW *)newwin(uVar7,uVar16,0,0);
  box(win,0x7c,0x3d);
  iVar5 = (int)(uVar16 >> 1);
  lVar11 = newwin(0x14,0x4f,(int)(uVar7 >> 1) + -0xc,iVar5 + -0x27);
  wattr_on(lVar11,0x40000,0);
  box(lVar11,0x7c,0x2d);
  wattr_off(lVar11,0x40000,0);
  uVar12 = new_panel(lVar11);
  local_560 = new_panel();
  local_550 = (string *)(puVar8 + 1);
  menu = updateMenu((MENU *)0x0,win,sats,items,local_550,false);
  mvwprintw(win,0,iVar5 + -0xc,"%s","}-- satnow 0.1.0 --{");
  mvwprintw(win,1,3,"%s",colNames._M_dataplus._M_p);
  iVar5 = wmove(win,(int)uVar7 + -3,1);
  if (iVar5 != -1) {
    whline(win,0x2d,(int)uVar16 + -2);
  }
  mvwprintw(win,(int)uVar7 + -2,1,"%s",
            "[Quit: (q)] [Update: (space)] [Movement: (pg)up/(pg)down] [Details: (d)]");
  update_panels();
  doupdate();
  iVar5 = this->_refreshSecs;
  if (iVar5 < 0) {
    iVar5 = -1;
  }
  local_558 = puVar8;
  wtimeout(_stdscr,iVar5);
  bVar17 = false;
  do {
    sVar4 = local_338;
    iVar5 = wgetch(_stdscr);
    puVar8 = local_558;
    if ((iVar5 == -1) || (iVar5 == 0x20)) {
      updateMenu(menu,win,sats,items,local_550,true);
      refresh();
    }
    else if (iVar5 == 100) {
      if (bVar17) {
        hide_panel(uVar12);
        bVar17 = (bool)(~bVar17 & 1U);
      }
      else {
        uVar15 = current_item(menu);
        iVar5 = item_index(uVar15);
        pSVar13 = SatLookAngles::operator[](sats,(long)iVar5);
        std::__cxx11::string::string((string *)&fields,(string *)pSVar13);
        _Var3 = fields._M_elems[0].second._M_dataplus;
        std::__cxx11::string::~string((string *)&fields);
        if (_Var3._M_p == (pointer)0x0) {
          std::__cxx11::to_string((string *)&fields,(pSVar13->first).norad_number_);
          mvwprintw(lVar11,1,1,"Name : %s (NORAD ID)",fields._M_elems[0].first);
        }
        else {
          std::__cxx11::string::string((string *)&fields,(string *)pSVar13);
          mvwprintw(lVar11,1,1,"Name : %s",fields._M_elems[0].first);
        }
        std::__cxx11::string::~string((string *)&fields);
        std::__cxx11::string::string((string *)&fields,(string *)&(pSVar13->first).line_one_);
        mvwprintw(lVar11,2,1,"Line1: %s",fields._M_elems[0].first);
        std::__cxx11::string::~string((string *)&fields);
        std::__cxx11::string::string((string *)&fields,(string *)&(pSVar13->first).line_two_);
        mvwprintw(lVar11,3,1,"Line2: %s",fields._M_elems[0].first);
        std::__cxx11::string::~string((string *)&fields);
        iVar5 = -1;
        if (lVar11 != 0) {
          iVar5 = *(short *)(lVar11 + 6) + 1;
        }
        iVar6 = wmove(lVar11,4,1);
        if (iVar6 != -1) {
          whline(lVar11,0x2d,iVar5 + -2);
        }
        std::__cxx11::to_string((string *)&ss_1,(pSVar13->first).norad_number_);
        fields._M_elems[0].first = "NORAD";
        fields._M_elems[0].second._M_dataplus._M_p = (pointer)&fields._M_elems[0].second.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_ss_1 == &local_330) {
          fields._M_elems[0].second.field_2._8_8_ = local_330._8_8_;
        }
        else {
          fields._M_elems[0].second._M_dataplus._M_p = _ss_1;
        }
        fields._M_elems[0].second.field_2._M_allocated_capacity._1_7_ =
             local_330._M_allocated_capacity._1_7_;
        fields._M_elems[0].second.field_2._M_local_buf[0] = local_330._M_local_buf[0];
        local_338 = 0;
        fields._M_elems[0].second._M_string_length = sVar4;
        local_330._M_local_buf[0] = '\0';
        _ss_1 = (pointer)&local_330;
        std::__cxx11::string::string
                  ((string *)&local_6a0,(string *)&(pSVar13->first).int_designator_);
        fields._M_elems[1].second._M_string_length = local_698;
        fields._M_elems[1].first = "Designator";
        fields._M_elems[1].second._M_dataplus._M_p = (pointer)&fields._M_elems[1].second.field_2;
        if (local_6a0 == &local_690) {
          fields._M_elems[1].second.field_2._8_8_ = uStack_688;
        }
        else {
          fields._M_elems[1].second._M_dataplus._M_p = local_6a0;
        }
        fields._M_elems[1].second.field_2._M_allocated_capacity._1_7_ = uStack_68f;
        fields._M_elems[1].second.field_2._M_local_buf[0] = local_690;
        local_698 = 0;
        local_690 = '\0';
        local_548.m_encoded = (pSVar13->first).epoch_.m_encoded;
        local_6a0 = &local_690;
        DateTime::ToString_abi_cxx11_(&local_5a0,&local_548);
        fields._M_elems[2].second._M_string_length = local_5a0._M_string_length;
        fields._M_elems[2].first = "Epoch";
        fields._M_elems[2].second._M_dataplus._M_p = (pointer)&fields._M_elems[2].second.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p == &local_5a0.field_2) {
          fields._M_elems[2].second.field_2._8_8_ = local_5a0.field_2._8_8_;
        }
        else {
          fields._M_elems[2].second._M_dataplus._M_p = local_5a0._M_dataplus._M_p;
        }
        fields._M_elems[2].second.field_2._M_allocated_capacity._1_7_ =
             local_5a0.field_2._M_allocated_capacity._1_7_;
        fields._M_elems[2].second.field_2._M_local_buf[0] = local_5a0.field_2._M_local_buf[0];
        local_5a0._M_string_length = 0;
        local_5a0.field_2._M_local_buf[0] = '\0';
        local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
        std::__cxx11::to_string(&local_5c0,(pSVar13->first).bstar_);
        fields._M_elems[3].second._M_string_length = local_5c0._M_string_length;
        fields._M_elems[3].first = "BSTAR(drag term)";
        fields._M_elems[3].second._M_dataplus._M_p = (pointer)&fields._M_elems[3].second.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p == &local_5c0.field_2) {
          fields._M_elems[3].second.field_2._8_8_ = local_5c0.field_2._8_8_;
        }
        else {
          fields._M_elems[3].second._M_dataplus._M_p = local_5c0._M_dataplus._M_p;
        }
        fields._M_elems[3].second.field_2._M_allocated_capacity._1_7_ =
             local_5c0.field_2._M_allocated_capacity._1_7_;
        fields._M_elems[3].second.field_2._M_local_buf[0] = local_5c0.field_2._M_local_buf[0];
        local_5c0._M_string_length = 0;
        local_5c0.field_2._M_local_buf[0] = '\0';
        local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        std::__cxx11::to_string(&local_5e0,(pSVar13->first).inclination_);
        fields._M_elems[4].second._M_string_length = local_5e0._M_string_length;
        fields._M_elems[4].first = "Inclination(deg)";
        fields._M_elems[4].second._M_dataplus._M_p = (pointer)&fields._M_elems[4].second.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e0._M_dataplus._M_p == &local_5e0.field_2) {
          fields._M_elems[4].second.field_2._8_8_ = local_5e0.field_2._8_8_;
        }
        else {
          fields._M_elems[4].second._M_dataplus._M_p = local_5e0._M_dataplus._M_p;
        }
        fields._M_elems[4].second.field_2._M_allocated_capacity._1_7_ =
             local_5e0.field_2._M_allocated_capacity._1_7_;
        fields._M_elems[4].second.field_2._M_local_buf[0] = local_5e0.field_2._M_local_buf[0];
        local_5e0._M_string_length = 0;
        local_5e0.field_2._M_local_buf[0] = '\0';
        local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
        std::__cxx11::to_string(&local_600,(pSVar13->first).right_ascending_node_);
        fields._M_elems[5].second._M_string_length = local_600._M_string_length;
        fields._M_elems[5].first = "RightAscention(deg)";
        fields._M_elems[5].second._M_dataplus._M_p = (pointer)&fields._M_elems[5].second.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_600._M_dataplus._M_p == &local_600.field_2) {
          fields._M_elems[5].second.field_2._8_8_ = local_600.field_2._8_8_;
        }
        else {
          fields._M_elems[5].second._M_dataplus._M_p = local_600._M_dataplus._M_p;
        }
        fields._M_elems[5].second.field_2._M_allocated_capacity._1_7_ =
             local_600.field_2._M_allocated_capacity._1_7_;
        fields._M_elems[5].second.field_2._M_local_buf[0] = local_600.field_2._M_local_buf[0];
        local_600._M_string_length = 0;
        local_600.field_2._M_local_buf[0] = '\0';
        local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
        std::__cxx11::to_string(&local_620,(pSVar13->first).eccentricity_);
        fields._M_elems[6].second._M_string_length = local_620._M_string_length;
        fields._M_elems[6].first = "Eccentricity";
        fields._M_elems[6].second._M_dataplus._M_p = (pointer)&fields._M_elems[6].second.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p == &local_620.field_2) {
          fields._M_elems[6].second.field_2._8_8_ = local_620.field_2._8_8_;
        }
        else {
          fields._M_elems[6].second._M_dataplus._M_p = local_620._M_dataplus._M_p;
        }
        fields._M_elems[6].second.field_2._M_allocated_capacity._1_7_ =
             local_620.field_2._M_allocated_capacity._1_7_;
        fields._M_elems[6].second.field_2._M_local_buf[0] = local_620.field_2._M_local_buf[0];
        local_620._M_string_length = 0;
        local_620.field_2._M_local_buf[0] = '\0';
        local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
        std::__cxx11::to_string(&local_640,(pSVar13->first).argument_perigee_);
        fields._M_elems[7].second._M_string_length = local_640._M_string_length;
        fields._M_elems[7].first = "ArgOfPerigee(deg)";
        fields._M_elems[7].second._M_dataplus._M_p = (pointer)&fields._M_elems[7].second.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_640._M_dataplus._M_p == &local_640.field_2) {
          fields._M_elems[7].second.field_2._8_8_ = local_640.field_2._8_8_;
        }
        else {
          fields._M_elems[7].second._M_dataplus._M_p = local_640._M_dataplus._M_p;
        }
        fields._M_elems[7].second.field_2._M_allocated_capacity._1_7_ =
             local_640.field_2._M_allocated_capacity._1_7_;
        fields._M_elems[7].second.field_2._M_local_buf[0] = local_640.field_2._M_local_buf[0];
        local_640._M_string_length = 0;
        local_640.field_2._M_local_buf[0] = '\0';
        local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
        std::__cxx11::to_string(&local_660,(pSVar13->first).mean_anomaly_);
        fields._M_elems[8].second._M_string_length = local_660._M_string_length;
        fields._M_elems[8].first = "MeanAnomaly(deg)";
        fields._M_elems[8].second._M_dataplus._M_p = (pointer)&fields._M_elems[8].second.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p == &local_660.field_2) {
          fields._M_elems[8].second.field_2._8_8_ = local_660.field_2._8_8_;
        }
        else {
          fields._M_elems[8].second._M_dataplus._M_p = local_660._M_dataplus._M_p;
        }
        fields._M_elems[8].second.field_2._M_allocated_capacity._1_7_ =
             local_660.field_2._M_allocated_capacity._1_7_;
        fields._M_elems[8].second.field_2._M_local_buf[0] = local_660.field_2._M_local_buf[0];
        local_660._M_string_length = 0;
        local_660.field_2._M_local_buf[0] = '\0';
        local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
        std::__cxx11::to_string(&local_680,(pSVar13->first).mean_motion_);
        fields._M_elems[9].second._M_string_length = local_680._M_string_length;
        fields._M_elems[9].first = "MeanMotion(revs per day)";
        fields._M_elems[9].second._M_dataplus._M_p = (pointer)&fields._M_elems[9].second.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_680._M_dataplus._M_p == &local_680.field_2) {
          fields._M_elems[9].second.field_2._8_8_ = local_680.field_2._8_8_;
        }
        else {
          fields._M_elems[9].second._M_dataplus._M_p = local_680._M_dataplus._M_p;
        }
        fields._M_elems[9].second.field_2._M_allocated_capacity._1_7_ =
             local_680.field_2._M_allocated_capacity._1_7_;
        fields._M_elems[9].second.field_2._M_local_buf[0] = local_680.field_2._M_local_buf[0];
        local_680._M_string_length = 0;
        local_680.field_2._M_local_buf[0] = '\0';
        local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
        std::__cxx11::to_string(&local_580,(pSVar13->first).orbit_number_);
        fields._M_elems[10].first = "RevolutionNumber";
        fields._M_elems[10].second._M_dataplus._M_p = (pointer)&fields._M_elems[10].second.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._M_dataplus._M_p == &local_580.field_2) {
          fields._M_elems[10].second.field_2._8_8_ = local_580.field_2._8_8_;
        }
        else {
          fields._M_elems[10].second._M_dataplus._M_p = local_580._M_dataplus._M_p;
        }
        fields._M_elems[10].second.field_2._M_allocated_capacity._1_7_ =
             local_580.field_2._M_allocated_capacity._1_7_;
        fields._M_elems[10].second.field_2._M_local_buf[0] = local_580.field_2._M_local_buf[0];
        fields._M_elems[10].second._M_string_length = local_580._M_string_length;
        local_580._M_string_length = 0;
        local_580.field_2._M_local_buf[0] = '\0';
        fields._M_elems[0xb].first = (char *)0x0;
        fields._M_elems[0xb].second._M_dataplus._M_p = (pointer)&fields._M_elems[0xb].second.field_2
        ;
        fields._M_elems[0xb].second._M_string_length = 0;
        fields._M_elems[0xb].second.field_2._M_local_buf[0] = '\0';
        local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
        std::__cxx11::string::~string((string *)&local_580);
        std::__cxx11::string::~string((string *)&local_680);
        std::__cxx11::string::~string((string *)&local_660);
        std::__cxx11::string::~string((string *)&local_640);
        std::__cxx11::string::~string((string *)&local_620);
        std::__cxx11::string::~string((string *)&local_600);
        std::__cxx11::string::~string((string *)&local_5e0);
        std::__cxx11::string::~string((string *)&local_5c0);
        std::__cxx11::string::~string((string *)&local_5a0);
        std::__cxx11::string::~string((string *)&local_6a0);
        std::__cxx11::string::~string((string *)&ss_1);
        iVar6 = 6;
        for (lVar14 = 0; lVar14 != 0x1e0; lVar14 = lVar14 + 0x28) {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
          *(long *)((long)alStack_320 +
                   *(long *)(CONCAT71(local_330._M_allocated_capacity._1_7_,
                                      local_330._M_local_buf[0]) + -0x18)) = (long)(iVar5 / 2 + -8);
          poVar10 = std::operator<<((ostream *)local_330._M_local_buf,
                                    *(char **)((long)&fields._M_elems[0].first + lVar14));
          poVar10 = std::operator<<(poVar10,": ");
          std::operator<<(poVar10,(string *)
                                  ((long)&fields._M_elems[0].second._M_dataplus._M_p + lVar14));
          std::__cxx11::stringbuf::str();
          mvwprintw(lVar11,iVar6,1,"%s",local_6a0);
          std::__cxx11::string::~string((string *)&local_6a0);
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss_1);
          iVar6 = iVar6 + 1;
        }
        std::
        array<std::pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_12UL>
        ::~array(&fields);
        show_panel(uVar12);
        top_panel(uVar12);
        bVar17 = (bool)(~bVar17 & 1U);
      }
    }
    else {
      if (iVar5 == 0x102) {
        uVar15 = 0x203;
      }
      else if (iVar5 == 0x103) {
        uVar15 = 0x202;
      }
      else if (iVar5 == 0x152) {
        uVar15 = 0x206;
      }
      else {
        if (iVar5 != 0x153) {
          if (iVar5 == 0x71) {
            for (uVar7 = 0;
                uVar7 < ((long)(sats->_sats).
                               super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(sats->_sats).
                              super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0xf8 + 1U;
                uVar7 = uVar7 + 1) {
              free_item(items[uVar7]);
            }
            operator_delete__(items);
            lVar11 = *puVar8 * 0x20;
            uVar7 = lVar11 + 8;
            uVar16 = *puVar8;
            while (uVar16 != 0) {
              std::__cxx11::string::~string((string *)((long)puVar8 + lVar11 + -0x18));
              lVar11 = lVar11 + -0x20;
              uVar16 = lVar11;
            }
            operator_delete__(puVar8,uVar7);
            delwin(win);
            del_panel(local_560);
            del_panel(uVar12);
            std::__cxx11::string::~string((string *)&colNames);
            std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
            return;
          }
          goto LAB_0010c3ff;
        }
        uVar15 = 0x207;
      }
      menu_driver(menu,uVar15);
    }
LAB_0010c3ff:
    update_panels();
    doupdate();
  } while( true );
}

Assistant:

void DisplayNCurses::render(SatLookAngles &sats) {
#if HAVE_GUI
  // Build the menu and have a place to store the strings.
  auto items = new ITEM *[sats.size() + 1]();
  auto itemStrs = new std::string[sats.size()];
  items[sats.size()] = nullptr;

  // Column names.
  std::stringstream ss;
  ss << std::left << std::setw(10) << "ID" << std::setw(25) << "NAME"
     << std::setw(15) << "AZIMUTH(deg)" << std::setw(15) << "ELEVATION(deg)"
     << std::setw(12) << "RANGE(KM)";
  std::string colNames = ss.str();

  // Create a window to decorate the menu with.
  const int rows = std::max(LINES, 25);
  const int cols = std::max(COLS, 80);
  auto win = newwin(rows, cols, 0, 0);
  box(win, '|', '=');

  // Create another window to hold selected information.
  auto infoWin = newwin(20, 79, (rows / 2) - 12, (cols / 2) - 39);
  wattron(infoWin, A_REVERSE);
  box(infoWin, '|', '-');
  wattroff(infoWin, A_REVERSE);

  // Create panels.
  auto infoPanel = new_panel(infoWin);
  auto mainPanel = new_panel(win);
  bool showInfo = false;

  // Populate menu ('false' avoids calculating new look angles);
  MENU *menu = updateMenu(nullptr, win, sats, items, itemStrs, false);

  // Add title and column names.
  mvwprintw(win, 0, (cols / 2 - 12), "%s", "}-- satnow " VER " --{");
  mvwprintw(win, 1, 3, "%s", colNames.c_str());

  // Print a legend at the bottom.
  mvwhline(win, rows - 3, 1, '-', cols - 2);
  mvwprintw(win, rows - 2, 1, "%s",
            "[Quit: (q)] [Update: (space)] "
            "[Movement: (pg)up/(pg)down] [Details: (d)]");

  // Display.
  update_panels();
  doupdate();
  const int msecs = (_refreshSecs < 0) ? -1 : _refreshSecs;
  timeout(msecs);
  int c;
  while ((c = getch()) != 'q') {
    switch (c) {
    case KEY_DOWN:
      menu_driver(menu, REQ_DOWN_ITEM);
      break;
    case KEY_UP:
      menu_driver(menu, REQ_UP_ITEM);
      break;
    case KEY_NPAGE:
      menu_driver(menu, REQ_SCR_DPAGE);
      break;
    case KEY_PPAGE:
      menu_driver(menu, REQ_SCR_UPAGE);
      break;
    case 'd':
      showInfo = showInfo ^ true;
      // Swap the main and info panel.
      if (showInfo) {
        const ITEM *ci = current_item(menu);
        updateInfoWindow(infoWin, sats[item_index(ci)]);
        show_panel(infoPanel);
        top_panel(infoPanel);
      } else
        hide_panel(infoPanel);
      break;
    case ' ':
    case ERR:
      updateMenu(menu, win, sats, items, itemStrs, true);
      refresh();
      break;
    }
    update_panels();
    doupdate();
  }

  // Cleanup.
  for (size_t i = 0; i < sats.size() + 1; ++i)
    free_item(items[i]);
  delete[] items;
  delete[] itemStrs;
  delwin(win);
  del_panel(mainPanel);
  del_panel(infoPanel);
#endif // HAVE_GUI
}